

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsModelUtils.cpp
# Opt level: O3

string * utilModelStatusToString_abi_cxx11_
                   (string *__return_storage_ptr__,HighsModelStatus model_status)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch(model_status) {
  case kMin:
    pcVar2 = "Not Set";
    pcVar1 = "";
    break;
  case kLoadError:
    pcVar2 = "Load error";
    pcVar1 = "";
    break;
  case kModelError:
    pcVar2 = "Model error";
    pcVar1 = "";
    break;
  case kPresolveError:
    pcVar2 = "Presolve error";
    pcVar1 = "";
    break;
  case kSolveError:
    pcVar2 = "Solve error";
    pcVar1 = "";
    break;
  case kPostsolveError:
    pcVar2 = "Postsolve error";
    pcVar1 = "";
    break;
  case kModelEmpty:
    pcVar2 = "Empty";
    pcVar1 = "";
    break;
  case kOptimal:
    pcVar2 = "Optimal";
    pcVar1 = "";
    break;
  case kInfeasible:
    pcVar2 = "Infeasible";
    pcVar1 = "";
    break;
  case kUnboundedOrInfeasible:
    pcVar2 = "Primal infeasible or unbounded";
    pcVar1 = "";
    break;
  case kUnbounded:
    pcVar2 = "Unbounded";
    pcVar1 = "";
    break;
  case kObjectiveBound:
    pcVar2 = "Bound on objective reached";
    pcVar1 = "";
    break;
  case kObjectiveTarget:
    pcVar2 = "Target for objective reached";
    pcVar1 = "";
    break;
  case kTimeLimit:
    pcVar2 = "Time limit reached";
    pcVar1 = "";
    break;
  case kIterationLimit:
    pcVar2 = "Iteration limit reached";
    pcVar1 = "";
    break;
  case kUnknown:
    pcVar2 = "Unknown";
    pcVar1 = "";
    break;
  case kSolutionLimit:
    pcVar2 = "Solution limit reached";
    pcVar1 = "";
    break;
  case kInterrupt:
    pcVar2 = "Interrupted by user";
    pcVar1 = "";
    break;
  case kMax:
    pcVar2 = "Memory limit reached";
    pcVar1 = "";
    break;
  default:
    pcVar2 = "Unrecognised HiGHS model status";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string utilModelStatusToString(const HighsModelStatus model_status) {
  switch (model_status) {
    case HighsModelStatus::kNotset:
      return "Not Set";
      break;
    case HighsModelStatus::kLoadError:
      return "Load error";
      break;
    case HighsModelStatus::kModelError:
      return "Model error";
      break;
    case HighsModelStatus::kPresolveError:
      return "Presolve error";
      break;
    case HighsModelStatus::kSolveError:
      return "Solve error";
      break;
    case HighsModelStatus::kPostsolveError:
      return "Postsolve error";
      break;
    case HighsModelStatus::kModelEmpty:
      return "Empty";
      break;
    case HighsModelStatus::kMemoryLimit:
      return "Memory limit reached";
      break;
    case HighsModelStatus::kOptimal:
      return "Optimal";
      break;
    case HighsModelStatus::kInfeasible:
      return "Infeasible";
      break;
    case HighsModelStatus::kUnboundedOrInfeasible:
      return "Primal infeasible or unbounded";
      break;
    case HighsModelStatus::kUnbounded:
      return "Unbounded";
      break;
    case HighsModelStatus::kObjectiveBound:
      return "Bound on objective reached";
      break;
    case HighsModelStatus::kObjectiveTarget:
      return "Target for objective reached";
      break;
    case HighsModelStatus::kTimeLimit:
      return "Time limit reached";
      break;
    case HighsModelStatus::kIterationLimit:
      return "Iteration limit reached";
      break;
    case HighsModelStatus::kSolutionLimit:
      return "Solution limit reached";
      break;
    case HighsModelStatus::kInterrupt:
      return "Interrupted by user";
      break;
    case HighsModelStatus::kUnknown:
      return "Unknown";
      break;
    default:
      assert(1 == 0);
      return "Unrecognised HiGHS model status";
  }
}